

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::LogParameter::ByteSizeLong(LogParameter *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar2 = 0;
  }
  else {
    unknown_fields = LogParameter::unknown_fields(this);
    sVar2 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    sVar3 = sVar2 + 5;
    if ((uVar1 & 1) == 0) {
      sVar3 = sVar2;
    }
    sVar4 = sVar3 + 5;
    if ((uVar1 & 2) == 0) {
      sVar4 = sVar3;
    }
    sVar2 = sVar4 + 5;
    if ((uVar1 & 4) == 0) {
      sVar2 = sVar4;
    }
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t LogParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.LogParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional float shift = 3 [default = 0];
    if (has_shift()) {
      total_size += 1 + 4;
    }

    // optional float base = 1 [default = -1];
    if (has_base()) {
      total_size += 1 + 4;
    }

    // optional float scale = 2 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}